

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O2

UntypedActionResultHolderBase * __thiscall
testing::internal::FunctionMocker<bool_(const_solitaire::geometry::Position_&)>::
UntypedPerformAction
          (FunctionMocker<bool_(const_solitaire::geometry::Position_&)> *this,void *untyped_action,
          void *untyped_args)

{
  ActionResultHolder<bool> *pAVar1;
  Action<bool_(const_solitaire::geometry::Position_&)> action;
  function<bool_(const_solitaire::geometry::Position_&)> local_30;
  
  std::function<bool_(const_solitaire::geometry::Position_&)>::function
            (&local_30,(function<bool_(const_solitaire::geometry::Position_&)> *)untyped_action);
  pAVar1 = ActionResultHolder<bool>::PerformAction<bool(solitaire::geometry::Position_const&)>
                     ((Action<bool_(const_solitaire::geometry::Position_&)> *)&local_30,
                      (ArgumentTuple *)untyped_args);
  std::_Function_base::~_Function_base(&local_30.super__Function_base);
  return &pAVar1->super_UntypedActionResultHolderBase;
}

Assistant:

UntypedActionResultHolderBase* UntypedPerformAction(
      const void* untyped_action, void* untyped_args) const override {
    // Make a copy of the action before performing it, in case the
    // action deletes the mock object (and thus deletes itself).
    const Action<F> action = *static_cast<const Action<F>*>(untyped_action);
    ArgumentTuple* args = static_cast<ArgumentTuple*>(untyped_args);
    return ResultHolder::PerformAction(action, std::move(*args));
  }